

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_llc_u_subtype(compiler_state_t *cstate,bpf_u_int32 subtype)

{
  block *b0;
  block *b1;
  
  b0 = gen_llc(cstate);
  b1 = gen_ncmp(cstate,OR_LLC,2,0x10,0xef,0x10,0,subtype);
  gen_and(b0,b1);
  return b1;
}

Assistant:

struct block *
gen_llc_u_subtype(compiler_state_t *cstate, bpf_u_int32 subtype)
{
	struct block *b0, *b1;

	/*
	 * Check whether this is an LLC frame.
	 */
	b0 = gen_llc(cstate);

	/*
	 * Now check for a U frame with the appropriate type.
	 */
	b1 = gen_mcmp(cstate, OR_LLC, 2, BPF_B, subtype, LLC_U_CMD_MASK);
	gen_and(b0, b1);
	return b1;
}